

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::~ConsoleReporter(ConsoleReporter *this)

{
  TestCaseInfo *this_00;
  IConfig *pIVar1;
  
  (this->super_StreamingReporterBase).super_SharedImpl<Catch::IStreamingReporter>.
  super_IStreamingReporter.super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__ConsoleReporter_00167190;
  std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::~vector
            (&(this->super_StreamingReporterBase).m_sectionStack);
  this_00 = (this->super_StreamingReporterBase).currentTestCaseInfo.
            super_Option<Catch::TestCaseInfo>.nullableValue;
  if (this_00 != (TestCaseInfo *)0x0) {
    TestCaseInfo::~TestCaseInfo(this_00);
  }
  (this->super_StreamingReporterBase).currentTestCaseInfo.super_Option<Catch::TestCaseInfo>.
  nullableValue = (TestCaseInfo *)0x0;
  Option<Catch::GroupInfo>::reset
            (&(this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>);
  Option<Catch::TestRunInfo>::reset
            (&(this->super_StreamingReporterBase).currentTestRunInfo.
              super_Option<Catch::TestRunInfo>);
  pIVar1 = (this->super_StreamingReporterBase).m_config.m_p;
  if (pIVar1 != (IConfig *)0x0) {
    (*(pIVar1->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
  }
  return;
}

Assistant:

StreamingReporterBase::~StreamingReporterBase() {}